

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O2

Boxed_Value __thiscall
chaiscript::eval::Fun_Call_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>
::do_eval_internal<false>
          (Fun_Call_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *this,
          Dispatch_State *t_ss)

{
  long lVar1;
  undefined8 *puVar2;
  element_type *this_00;
  Proxy_Function_Base *params_00;
  Dispatch_State *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined8 *puVar3;
  Boxed_Value BVar4;
  Const_Proxy_Function f;
  Function_Push_Pop fpp;
  Boxed_Value fn;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> params;
  undefined1 local_e8 [8];
  reference_wrapper<chaiscript::Type_Conversions::Conversion_Saves> local_e0 [11];
  element_type *local_88;
  Function_Push_Pop local_60;
  undefined1 local_58 [16];
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> local_48;
  
  local_88 = (element_type *)this;
  detail::Function_Push_Pop::Function_Push_Pop(&local_60,in_RDX);
  local_48.super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar1 = *(long *)((long)&((t_ss[2].m_conversions.m_conversions._M_data)->m_mutex)._M_impl.
                           _M_rwlock + 8);
  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::reserve
            (&local_48,*(long *)(lVar1 + 0x58) - *(long *)(lVar1 + 0x50) >> 3);
  lVar1 = *(long *)((long)&((t_ss[2].m_conversions.m_conversions._M_data)->m_mutex)._M_impl.
                           _M_rwlock + 8);
  puVar2 = *(undefined8 **)(lVar1 + 0x58);
  for (puVar3 = *(undefined8 **)(lVar1 + 0x50); puVar3 != puVar2; puVar3 = puVar3 + 1) {
    AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>::eval
              ((AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *)
               local_e8,(Dispatch_State *)*puVar3);
    std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::
    emplace_back<chaiscript::Boxed_Value>(&local_48,(Boxed_Value *)local_e8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_e0);
  }
  AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>::eval
            ((AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *)
             local_58,(Dispatch_State *)
                      ((t_ss[2].m_conversions.m_conversions._M_data)->m_mutex)._M_impl._M_rwlock.
                      __align);
  this_00 = local_88;
  params_00 = chaiscript::detail::Dispatch_Engine::
              boxed_cast<chaiscript::dispatch::Proxy_Function_Base_const*>
                        ((in_RDX->m_engine)._M_data,(Boxed_Value *)local_58);
  local_e8 = (undefined1  [8])
             local_48.
             super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if (local_48.super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_48.super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_e8 = (undefined1  [8])(Type_Conversions *)0x0;
  }
  local_e0[0]._M_data =
       (Conversion_Saves *)
       local_48.
       super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>._M_impl
       .super__Vector_impl_data._M_finish;
  if (local_48.super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_48.super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_e0[0]._M_data = (Conversion_Saves *)(Type_Conversions *)0x0;
  }
  dispatch::Proxy_Function_Base::operator()
            ((Proxy_Function_Base *)this_00,(Function_Params *)params_00,
             (Type_Conversions_State *)local_e8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8));
  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::~vector(&local_48)
  ;
  detail::Function_Push_Pop::~Function_Push_Pop(&local_60);
  BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = this_00;
  return (Boxed_Value)
         BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value do_eval_internal(const chaiscript::detail::Dispatch_State &t_ss) const {
        chaiscript::eval::detail::Function_Push_Pop fpp(t_ss);

        std::vector<Boxed_Value> params;

        params.reserve(this->children[1]->children.size());
        for (const auto &child : this->children[1]->children) {
          params.push_back(child->eval(t_ss));
        }

        if (Save_Params) {
          fpp.save_params(Function_Params{params});
        }

        Boxed_Value fn(this->children[0]->eval(t_ss));

        try {
          return (*t_ss->boxed_cast<const dispatch::Proxy_Function_Base *>(fn))(Function_Params{params}, t_ss.conversions());
        } catch (const exception::dispatch_error &e) {
          throw exception::eval_error(std::string(e.what()) + " with function '" + this->children[0]->text + "'",
                                      e.parameters,
                                      e.functions,
                                      false,
                                      *t_ss);
        } catch (const exception::bad_boxed_cast &) {
          try {
            using ConstFunctionTypeRef = const Const_Proxy_Function &;
            Const_Proxy_Function f = t_ss->boxed_cast<ConstFunctionTypeRef>(fn);
            // handle the case where there is only 1 function to try to call and dispatch fails on it
            throw exception::eval_error("Error calling function '" + this->children[0]->text + "'", params, make_vector(f), false, *t_ss);
          } catch (const exception::bad_boxed_cast &) {
            throw exception::eval_error("'" + this->children[0]->pretty_print() + "' does not evaluate to a function.");
          }
        } catch (const exception::arity_error &e) {
          throw exception::eval_error(std::string(e.what()) + " with function '" + this->children[0]->text + "'");
        } catch (const exception::guard_error &e) {
          throw exception::eval_error(std::string(e.what()) + " with function '" + this->children[0]->text + "'");
        } catch (detail::Return_Value &rv) {
          return rv.retval;
        }
      }